

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O3

void mqc_erterm_enc(opj_mqc_t *mqc)

{
  uint uVar1;
  int iVar2;
  
  iVar2 = 0xc;
  uVar1 = mqc->ct;
  while (iVar2 = iVar2 - uVar1, 0 < iVar2) {
    mqc->c = mqc->c << ((byte)uVar1 & 0x1f);
    mqc->ct = 0;
    mqc_byteout(mqc);
    uVar1 = mqc->ct;
  }
  if (*mqc->bp != 0xff) {
    mqc_byteout(mqc);
    return;
  }
  return;
}

Assistant:

void mqc_erterm_enc(opj_mqc_t *mqc) {
	int k = 11 - mqc->ct + 1;
	
	while (k > 0) {
		mqc->c <<= mqc->ct;
		mqc->ct = 0;
		mqc_byteout(mqc);
		k -= mqc->ct;
	}
	
	if (*mqc->bp != 0xff) {
		mqc_byteout(mqc);
	}
}